

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

value_type * __thiscall
nonstd::optional_lite::optional<std::__cxx11::string>::value_or<char_const(&)[2]>
          (value_type *__return_storage_ptr__,void *this,char (*v) [2])

{
  char cVar1;
  allocator local_59;
  ulong *local_58;
  size_type local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  ulong *local_38;
  size_type local_30;
  ulong local_28;
  undefined8 uStack_20;
  
  cVar1 = *this;
  if (cVar1 == '\x01') {
    std::__cxx11::string::string((string *)&local_38,(string *)((long)this + 8));
  }
  else {
    std::__cxx11::string::string((string *)&local_58,*v,&local_59);
    if (local_58 == (ulong *)&local_48) {
      local_58 = &local_28;
      uStack_20 = uStack_40;
    }
    local_28 = CONCAT71(uStack_47,local_48);
    local_30 = local_50;
    local_50 = 0;
    local_48 = 0;
    local_38 = local_58;
    local_58 = (ulong *)&local_48;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_38 == &local_28) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_28;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_20;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_28;
  }
  __return_storage_ptr__->_M_string_length = local_30;
  local_30 = 0;
  local_28 = local_28 & 0xffffffffffffff00;
  local_38 = &local_28;
  std::__cxx11::string::~string((string *)&local_38);
  if (cVar1 == '\0') {
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

optional_constexpr14 value_type value_or( U && v ) optional_refref_qual
    {
#if optional_COMPILER_CLANG_VERSION
        return has_value() ? /*std::move*/( contained.value() ) : static_cast<T>(std::forward<U>( v ) );
#else
        return has_value() ? std::move( contained.value() ) : static_cast<T>(std::forward<U>( v ) );
#endif
    }